

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_full.c
# Opt level: O2

int picnic_l3_full_verify
              (picnic_l3_full_publickey_t *pk,uint8_t *message,size_t message_len,uint8_t *signature
              ,size_t signature_len)

{
  int iVar1;
  picnic_instance_t *pp;
  picnic_context_t context;
  picnic_context_t local_e0;
  
  iVar1 = -1;
  if (signature_len != 0 && (signature != (uint8_t *)0x0 && pk != (picnic_l3_full_publickey_t *)0x0)
     ) {
    pp = picnic_instance_get(Picnic_L3_full);
    if (pp != (picnic_instance_t *)0x0) {
      mzd_from_char_array(local_e0.m_plaintext,pk->data + 0x18,0x18);
      mzd_from_char_array(local_e0.m_key,pk->data,0x18);
      local_e0.private_key = (uint8_t *)0x0;
      local_e0.unruh = false;
      local_e0.plaintext = pk->data + 0x18;
      local_e0.public_key = pk->data;
      local_e0.msg = message;
      local_e0.msglen = message_len;
      iVar1 = picnic_impl_verify(pp,&local_e0,signature,signature_len);
    }
  }
  return iVar1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_full_verify(const picnic_l3_full_publickey_t* pk,
                                                  const uint8_t* message, size_t message_len,
                                                  const uint8_t* signature, size_t signature_len) {
  if (!pk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* pk_c  = PK_C(pk);
  const uint8_t* pk_pt = PK_PT(pk);

  picnic_context_t context;
  mzd_from_char_array(context.m_plaintext, pk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(context.m_key, pk_c, LOWMC_BLOCK_SZ);
  context.plaintext   = PK_PT(pk);
  context.private_key = NULL;
  context.public_key  = PK_C(pk);
  context.msg         = message;
  context.msglen      = message_len;
#if defined(WITH_UNRUH)
  context.unruh = (PARAM == Picnic_L1_UR || PARAM == Picnic_L3_UR || PARAM == Picnic_L5_UR);
#endif
  return picnic_impl_verify(instance, &context, signature, signature_len);
}